

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapStoreOptimization.cpp
# Opt level: O1

void __thiscall
wasm::anon_unknown_166::HeapStoreOptimization::visitFunction
          (HeapStoreOptimization *this,Function *curr)

{
  Id IVar1;
  pointer puVar2;
  BasicBlock *pBVar3;
  pointer pppEVar4;
  Expression **ppEVar5;
  StructSet *set;
  LocalSet *pLVar6;
  StructSet *pSVar7;
  undefined8 uVar8;
  int iVar9;
  StructSet *set_00;
  bool bVar10;
  pointer puVar11;
  ulong uVar12;
  char cVar13;
  pointer pppEVar14;
  ulong uVar15;
  Expression *pEVar16;
  ulong uVar17;
  Nop *output;
  uint uVar18;
  EffectAnalyzer local_370;
  undefined1 local_210 [8];
  EffectAnalyzer firstEffects;
  uint local_3c;
  
  puVar11 = (this->
            super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
            ).
            super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
            .basicBlocks.
            super__Vector_base<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->
           super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
           ).
           super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
           .basicBlocks.
           super__Vector_base<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar11 != puVar2) {
    do {
      pBVar3 = (puVar11->_M_t).
               super___uniq_ptr_impl<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>
               .
               super__Head_base<0UL,_wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_false>
               ._M_head_impl;
      pppEVar4 = *(pointer *)((long)&(pBVar3->contents).actions + 8);
      for (pppEVar14 = *(pointer *)&(pBVar3->contents).actions; pppEVar14 != pppEVar4;
          pppEVar14 = pppEVar14 + 1) {
        ppEVar5 = *pppEVar14;
        set = (StructSet *)*ppEVar5;
        IVar1 = (set->super_SpecificExpression<(wasm::Expression::Id)67>).super_Expression._id;
        if (IVar1 == BlockId) {
          if (*(long *)&set->order != 0) {
            uVar17 = 0;
            local_3c = 2;
            do {
              pLVar6 = *(LocalSet **)(&set->value->_id + uVar17 * 8);
              iVar9 = (int)uVar17;
              if (((pLVar6->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id
                   == LocalSetId) &&
                 (firstEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
                       (size_t)pLVar6->value,
                 ((Expression *)
                 firstEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count)->_id
                 == StructNewId)) {
                uVar15 = (ulong)(iVar9 + 1);
                uVar12 = *(ulong *)&set->order;
                uVar18 = local_3c;
                if (uVar15 < uVar12) {
                  do {
                    pSVar7 = *(StructSet **)(&set->value->_id + uVar15 * 8);
                    IVar1 = (pSVar7->super_SpecificExpression<(wasm::Expression::Id)67>).
                            super_Expression._id;
                    pEVar16 = (Expression *)0x0;
                    set_00 = (StructSet *)0x0;
                    if ((IVar1 == StructSetId) &&
                       (pEVar16 = pSVar7->ref, set_00 = pSVar7, pEVar16->_id != LocalGetId)) {
                      pEVar16 = (Expression *)0x0;
                    }
                    if (((IVar1 == StructSetId) && (pEVar16 != (Expression *)0x0)) &&
                       (*(Index *)(pEVar16 + 1) == pLVar6->index)) {
                      bVar10 = optimizeSubsequentStructSet
                                         (this,(StructNew *)
                                               firstEffects.delegateTargets._M_t._M_impl.
                                               super__Rb_tree_header._M_node_count,set_00,pLVar6);
                      cVar13 = '\x05';
                      if (bVar10) {
                        (set_00->super_SpecificExpression<(wasm::Expression::Id)67>).
                        super_Expression._id = NopId;
                        (set_00->super_SpecificExpression<(wasm::Expression::Id)67>).
                        super_Expression.type.id = 0;
                        cVar13 = '\0';
                      }
                    }
                    else {
                      if ((uVar12 - 1 == uVar15) ||
                         ((IVar1 == LocalSetId && (pSVar7->ref->_id == StructNewId)))) {
                        bVar10 = false;
                      }
                      else {
                        if ((uVar12 <= uVar17) ||
                           (EffectAnalyzer::EffectAnalyzer
                                      ((EffectAnalyzer *)local_210,
                                       &((this->
                                         super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
                                         ).super_Pass.runner)->options,
                                       (this->
                                       super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
                                       ).
                                       super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
                                       .
                                       super_PostWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>_>
                                       .
                                       super_Walker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>_>
                                       .currModule,*(Expression **)(&set->value->_id + uVar17 * 8)),
                           *(ulong *)&set->order <= uVar15)) {
LAB_008d8092:
                          __assert_fail("index < usedElements",
                                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                                        ,0xbc,
                                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                                       );
                        }
                        EffectAnalyzer::EffectAnalyzer
                                  (&local_370,
                                   &((this->
                                     super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
                                     ).super_Pass.runner)->options,
                                   (this->
                                   super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
                                   ).
                                   super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
                                   .
                                   super_PostWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>_>
                                   .
                                   super_Walker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>_>
                                   .currModule,*(Expression **)(&set->value->_id + uVar15 * 8));
                        bVar10 = EffectAnalyzer::invalidates(&local_370,(EffectAnalyzer *)local_210)
                        ;
                        if (!bVar10) {
                          if ((*(ulong *)&set->order <= uVar17) || (*(ulong *)&set->order <= uVar15)
                             ) goto LAB_008d8092;
                          pEVar16 = set->value;
                          uVar8 = *(undefined8 *)(&pEVar16->_id + uVar17 * 8);
                          *(undefined8 *)(&pEVar16->_id + uVar17 * 8) =
                               *(undefined8 *)(&pEVar16->_id + uVar15 * 8);
                          *(undefined8 *)(&pEVar16->_id + uVar15 * 8) = uVar8;
                        }
                        bVar10 = !bVar10;
                        std::
                        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                        ::~_Rb_tree(&local_370.delegateTargets._M_t);
                        std::
                        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                        ::~_Rb_tree(&local_370.breakTargets._M_t);
                        std::
                        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                        ::~_Rb_tree(&local_370.globalsWritten._M_t);
                        std::
                        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                        ::~_Rb_tree(&local_370.mutableGlobalsRead._M_t);
                        std::
                        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                        ::~_Rb_tree(&local_370.localsWritten._M_t);
                        std::
                        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                        ::~_Rb_tree(&local_370.localsRead._M_t);
                        std::
                        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                        ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                     *)&firstEffects.breakTargets._M_t._M_impl.super__Rb_tree_header
                                        ._M_node_count);
                        std::
                        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                        ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                     *)&firstEffects.danglingPop);
                        std::
                        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                        ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                     *)&firstEffects.mutableGlobalsRead._M_t._M_impl.
                                        super__Rb_tree_header._M_node_count);
                        std::
                        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                        ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                     *)&firstEffects.localsWritten._M_t._M_impl.
                                        super__Rb_tree_header._M_node_count);
                        std::
                        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                     *)&firstEffects.localsRead._M_t._M_impl.super__Rb_tree_header.
                                        _M_node_count);
                        std::
                        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                     *)&firstEffects.features);
                      }
                      if (bVar10 != false) {
                        uVar17 = (ulong)(uVar18 - 1);
                      }
                      cVar13 = bVar10 * '\x02' + '\x05';
                    }
                    if ((cVar13 != '\a') && (cVar13 != '\0')) break;
                    uVar15 = (ulong)uVar18;
                    uVar12 = *(ulong *)&set->order;
                    uVar18 = uVar18 + 1;
                  } while (uVar15 < uVar12);
                }
              }
              uVar17 = (ulong)(iVar9 + 1);
              local_3c = local_3c + 1;
            } while (uVar17 < *(ulong *)&set->order);
          }
        }
        else {
          if (IVar1 != StructSetId) {
            handle_unreachable("bad action",
                               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/HeapStoreOptimization.cpp"
                               ,0x4c);
          }
          pLVar6 = (LocalSet *)set->ref;
          if ((((pLVar6->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id ==
                LocalSetId) &&
              ((((StructNew *)pLVar6->value)->super_SpecificExpression<(wasm::Expression::Id)65>).
               super_Expression._id == StructNewId)) &&
             (bVar10 = optimizeSubsequentStructSet(this,(StructNew *)pLVar6->value,set,pLVar6),
             bVar10)) {
            LocalSet::makeSet(pLVar6);
            *ppEVar5 = (Expression *)pLVar6;
          }
        }
      }
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar2);
  }
  return;
}

Assistant:

void visitFunction(Function* curr) {
    // Now that the walk is complete and we have a CFG, find things to optimize.
    for (auto& block : basicBlocks) {
      for (auto** currp : block->contents.actions) {
        auto* curr = *currp;
        if (auto* set = curr->dynCast<StructSet>()) {
          optimizeStructSet(set, currp);
        } else if (auto* block = curr->dynCast<Block>()) {
          optimizeBlock(block);
        } else {
          WASM_UNREACHABLE("bad action");
        }
      }
    }
  }